

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txdb.cpp
# Opt level: O0

bool __thiscall CCoinsViewDB::GetCoin(CCoinsViewDB *this,COutPoint *outpoint,Coin *coin)

{
  long lVar1;
  bool bVar2;
  pointer this_00;
  long in_FS_OFFSET;
  Coin *unaff_retaddr;
  CoinEntry *in_stack_00000008;
  CDBWrapper *in_stack_00000010;
  unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_> *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = std::unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_>::operator->
                      (in_stack_ffffffffffffffb8);
  anon_unknown.dwarf_22c0cd2::CoinEntry::CoinEntry((CoinEntry *)this_00,(COutPoint *)0x141ba7b);
  bVar2 = CDBWrapper::Read<(anonymous_namespace)::CoinEntry,Coin>
                    (in_stack_00000010,in_stack_00000008,unaff_retaddr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsViewDB::GetCoin(const COutPoint &outpoint, Coin &coin) const {
    return m_db->Read(CoinEntry(&outpoint), coin);
}